

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O1

int set_file_compression(int argc,char **argv)

{
  char *pcVar1;
  FILE *__stream;
  int iVar2;
  ulonglong uVar3;
  ulonglong uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  int iVar7;
  
  iVar7 = 0;
  uVar3 = strtoull(*argv,(char **)0x0,10);
  pcVar1 = argv[1];
  iVar2 = strcasecmp(pcVar1,"default");
  if (iVar2 == 0) {
    uVar6 = 0xffffffff;
  }
  else {
    iVar2 = strcasecmp(pcVar1,"store");
    uVar6 = 0;
    if (iVar2 != 0) {
      iVar2 = strcasecmp(pcVar1,"deflate");
      if (iVar2 == 0) {
        uVar6 = 8;
      }
      else {
        iVar2 = strcasecmp(pcVar1,"xz");
        if (iVar2 == 0) {
          uVar6 = 0x5f;
        }
        else {
          iVar2 = strcasecmp(pcVar1,"unknown");
          uVar6 = 100;
          if (iVar2 != 0) {
            uVar6 = 0;
          }
        }
      }
    }
  }
  uVar4 = strtoull(argv[2],(char **)0x0,10);
  iVar2 = zip_set_file_compression(za,uVar3,uVar6,uVar4 & 0xffffffff);
  __stream = _stderr;
  if (iVar2 < 0) {
    pcVar1 = argv[1];
    uVar5 = zip_strerror(za);
    fprintf(__stream,
            "can\'t set file compression method at index \'%lu\' to \'%s\', flags \'%u\': %s\n",
            uVar3,pcVar1,uVar4 & 0xffffffff,uVar5);
    iVar7 = -1;
  }
  return iVar7;
}

Assistant:

static int
set_file_compression(int argc, char *argv[]) {
    zip_int32_t method;
    zip_uint32_t flags;
    zip_uint64_t idx;
    idx = strtoull(argv[0], NULL, 10);
    method = get_compression_method(argv[1]);
    flags = (zip_uint32_t)strtoull(argv[2], NULL, 10);
    if (zip_set_file_compression(za, idx, method, flags) < 0) {
	fprintf(stderr, "can't set file compression method at index '%" PRIu64 "' to '%s', flags '%" PRIu32 "': %s\n", idx, argv[1], flags, zip_strerror(za));
	return -1;
    }
    return 0;
}